

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O3

int Wlc_NtkCexResim(Gia_Man_t *pAbs,Abc_Cex_t *p,Vec_Int_t *vFirstTotal,int iBit,Vec_Wrd_t *vRes,
                   int iFrame)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  word wVar11;
  long lVar12;
  
  pVVar5 = pAbs->vCis;
  uVar10 = (ulong)(uint)pVVar5->nSize;
  if (pAbs->nRegs < pVVar5->nSize) {
    lVar9 = 0;
    do {
      if ((int)uVar10 <= lVar9) goto LAB_0035f9d8;
      lVar12 = (long)pVVar5->pArray[lVar9];
      if ((lVar12 < 0) || (pAbs->nObjs <= pVVar5->pArray[lVar9])) goto LAB_0035f9b9;
      pGVar2 = pAbs->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      *(ulong *)(pGVar2 + lVar12) =
           *(ulong *)(pGVar2 + lVar12) & 0xffffffffbfffffff |
           (ulong)(((uint)(&p[1].iPo)[(int)((ulong)(uint)iBit + lVar9) >> 5] >>
                    ((byte)((ulong)(uint)iBit + lVar9) & 0x1f) & 1) << 0x1e);
      lVar9 = lVar9 + 1;
      pVVar5 = pAbs->vCis;
      uVar10 = (ulong)pVVar5->nSize;
    } while (lVar9 < (long)(uVar10 - (long)pAbs->nRegs));
    iBit = iBit + (int)lVar9;
  }
  iVar8 = pAbs->nObjs;
  if (0 < iVar8) {
    lVar9 = 0;
    lVar12 = 0;
    do {
      pGVar2 = pAbs->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar10 = *(ulong *)(&pGVar2->field_0x0 + lVar9);
      if ((uVar10 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar10) {
        *(ulong *)(&pGVar2->field_0x0 + lVar9) =
             uVar10 & 0xffffffff3fffffff |
             (ulong)((((uint)(uVar10 >> 0x3d) ^
                      *(uint *)((long)pGVar2 +
                               (ulong)((uint)(uVar10 >> 0x1e) & 0x7ffffffc) * -3 + lVar9) >> 0x1e) &
                      ((uint)(uVar10 >> 0x1d) & 7 ^
                      *(uint *)((long)pGVar2 +
                               (ulong)(uint)((int)(uVar10 & 0x1fffffff) << 2) * -3 + lVar9) >> 0x1e)
                     & 1) << 0x1e);
        iVar8 = pAbs->nObjs;
      }
      lVar12 = lVar12 + 1;
      lVar9 = lVar9 + 0xc;
    } while (lVar12 < iVar8);
  }
  pVVar5 = pAbs->vCos;
  if (0 < pVVar5->nSize) {
    lVar9 = 0;
    do {
      iVar8 = pVVar5->pArray[lVar9];
      if (((long)iVar8 < 0) || (pAbs->nObjs <= iVar8)) goto LAB_0035f9b9;
      if (pAbs->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = pAbs->pObjs + iVar8;
      uVar6 = (uint)*(ulong *)pGVar2;
      *(ulong *)pGVar2 =
           *(ulong *)pGVar2 & 0xffffffffbfffffff |
           (ulong)((uVar6 * 2 ^ *(uint *)(pGVar2 + -(ulong)(uVar6 & 0x1fffffff))) & 0x40000000);
      lVar9 = lVar9 + 1;
      pVVar5 = pAbs->vCos;
    } while (lVar9 < pVVar5->nSize);
  }
  iVar8 = pAbs->nRegs;
  if (0 < iVar8) {
    iVar4 = 0;
LAB_0035f7e1:
    iVar7 = pAbs->vCos->nSize;
    uVar6 = (iVar7 - iVar8) + iVar4;
    if (((int)uVar6 < 0) || (iVar7 <= (int)uVar6)) {
LAB_0035f9d8:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar7 = pAbs->vCos->pArray[uVar6];
    if (((long)iVar7 < 0) || (pAbs->nObjs <= iVar7)) {
LAB_0035f9b9:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar2 = pAbs->pObjs;
    if (pGVar2 != (Gia_Obj_t *)0x0) {
      iVar1 = pAbs->vCis->nSize;
      uVar6 = (iVar1 - iVar8) + iVar4;
      if (((int)uVar6 < 0) || (iVar1 <= (int)uVar6)) goto LAB_0035f9d8;
      uVar6 = pAbs->vCis->pArray[uVar6];
      lVar9 = (long)(int)uVar6;
      if ((lVar9 < 0) || ((uint)pAbs->nObjs <= uVar6)) goto LAB_0035f9b9;
      *(ulong *)(pGVar2 + lVar9) =
           *(ulong *)(pGVar2 + lVar9) & 0xffffffffbfffffff |
           (ulong)((uint)*(undefined8 *)(pGVar2 + iVar7) & 0x40000000);
      iVar4 = iVar4 + 1;
      iVar8 = pAbs->nRegs;
      if (iVar4 < iVar8) goto LAB_0035f7e1;
    }
  }
  iVar8 = vFirstTotal->nSize;
  if (0 < (long)iVar8) {
    piVar3 = vFirstTotal->pArray;
    lVar9 = (long)(iFrame * iVar8);
    lVar12 = 0;
    do {
      uVar6 = piVar3[lVar12];
      if (uVar6 == 0) {
        if (lVar12 + lVar9 < 0) goto LAB_0035f9f7;
        iVar4 = vRes->nSize;
        wVar11 = 0xffffffffffffffff;
      }
      else {
        iVar7 = (int)uVar6 >> 10;
        iVar4 = pAbs->vCis->nSize;
        if (iVar4 <= iVar7) {
          __assert_fail("First < Gia_ManCiNum(pAbs)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                        ,0x2e4,
                        "int Wlc_NtkCexResim(Gia_Man_t *, Abc_Cex_t *, Vec_Int_t *, int, Vec_Wrd_t *, int)"
                       );
        }
        uVar6 = uVar6 & 0x3ff;
        if (0x40 < uVar6) {
          __assert_fail("nBits <= 64",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                        ,0x2e6,
                        "int Wlc_NtkCexResim(Gia_Man_t *, Abc_Cex_t *, Vec_Int_t *, int, Vec_Wrd_t *, int)"
                       );
        }
        if (uVar6 == 0) {
          wVar11 = 0;
        }
        else {
          uVar10 = 0;
          wVar11 = 0;
          do {
            if ((iVar7 < 0) || ((long)iVar4 <= (long)(uVar10 + (long)iVar7))) goto LAB_0035f9d8;
            iVar1 = pAbs->vCis->pArray[(long)iVar7 + uVar10];
            if (((long)iVar1 < 0) || (pAbs->nObjs <= iVar1)) goto LAB_0035f9b9;
            wVar11 = wVar11 | 1L << ((byte)uVar10 & 0x3f) &
                              (*(long *)(pAbs->pObjs + iVar1) << 0x21) >> 0x3f;
            uVar10 = uVar10 + 1;
          } while (uVar6 != uVar10);
        }
        if (lVar12 + lVar9 < 0) goto LAB_0035f9f7;
        iVar4 = vRes->nSize;
      }
      if ((long)iVar4 <= lVar12 + lVar9) {
LAB_0035f9f7:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
      }
      vRes->pArray[lVar12 + lVar9] = wVar11;
      lVar12 = lVar12 + 1;
    } while (lVar12 != iVar8);
  }
  return iBit;
}

Assistant:

int Wlc_NtkCexResim( Gia_Man_t * pAbs, Abc_Cex_t * p, Vec_Int_t * vFirstTotal, int iBit, Vec_Wrd_t * vRes, int iFrame )
{
    Gia_Obj_t * pObj, * pObjRi, * pObjRo; 
    int k, b, Entry, First, nBits; word Value;
    // assuming that flop outputs have been assigned in the previous timeframe
    // assign primary inputs
    Gia_ManForEachPi( pAbs, pObj, k )
        pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
    // simulate
    Gia_ManForEachAnd( pAbs, pObj, k )
        pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                       (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
    // transfer to combinational outputs
    Gia_ManForEachCo( pAbs, pObj, k )
        pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
    // transfer values to flop outputs
    Gia_ManForEachRiRo( pAbs, pObjRi, pObjRo, k )
        pObjRo->fMark0 = pObjRi->fMark0;
    // at this point PIs and FOs area assigned according to this time-frame
    // collect values
    Vec_IntForEachEntry( vFirstTotal, Entry, k )
    {
        if ( Entry == 0 )
        {
            Vec_WrdWriteEntry( vRes, Vec_IntSize(vFirstTotal)*iFrame + k, ~(word)0 );
            continue;
        }
        First = Entry >> 10;
        assert( First < Gia_ManCiNum(pAbs) );
        nBits = Entry & 0x3FF;
        assert( nBits <= 64 );
        Value = 0;
        for ( b = 0; b < nBits; b++ )
            if ( Gia_ManCi(pAbs, First+b)->fMark0 )
                Value |= ((word)1) << b;
        Vec_WrdWriteEntry( vRes, Vec_IntSize(vFirstTotal)*iFrame + k, Value );
    }
    return iBit;
}